

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O0

void __thiscall
TasGrid::TasmanianSparseGrid::makeLocalPolynomialGrid
          (TasmanianSparseGrid *this,int dimensions,int outputs,int depth,int order,
          TypeOneDRule rule,vector<int,_std::allocator<int>_> *level_limits)

{
  string *__return_storage_ptr__;
  bool bVar1;
  invalid_argument *piVar2;
  size_type sVar3;
  TypeOneDRule rule_00;
  pointer local_108;
  unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>
  local_100;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_b8 [8];
  string message_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  string message;
  TypeOneDRule local_24;
  int local_20;
  TypeOneDRule rule_local;
  int order_local;
  int depth_local;
  int outputs_local;
  int dimensions_local;
  TasmanianSparseGrid *this_local;
  
  local_24 = rule;
  local_20 = order;
  rule_local = depth;
  order_local = outputs;
  depth_local = dimensions;
  _outputs_local = this;
  if (dimensions < 1) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (piVar2,"ERROR: makeLocalPolynomialGrid() requires positive dimensions");
    __cxa_throw(piVar2,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument
               );
  }
  if (outputs < 0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (piVar2,"ERROR: makeLocalPolynomialGrid() requires non-negative outputs");
    __cxa_throw(piVar2,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument
               );
  }
  if (depth < 0) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument
              (piVar2,"ERROR: makeLocalPolynomialGrid() requires non-negative depth");
    __cxa_throw(piVar2,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument
               );
  }
  if (order < -1) {
    __return_storage_ptr__ = (string *)((long)&message_1.field_2 + 8);
    ::std::__cxx11::to_string(__return_storage_ptr__,order);
    ::std::operator+(&local_78,"ERROR: makeLocalPolynomialGrid() is called with order: ",
                     __return_storage_ptr__);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     &local_78,", but the order cannot be less than -1.");
    ::std::__cxx11::string::~string((string *)&local_78);
    ::std::__cxx11::string::~string((string *)(message_1.field_2._M_local_buf + 8));
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument(piVar2,(string *)local_58);
    __cxa_throw(piVar2,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument
               );
  }
  bVar1 = OneDimensionalMeta::isLocalPolynomial(rule);
  if (!bVar1) {
    IO::getRuleString_abi_cxx11_(&local_f8,(IO *)(ulong)local_24,rule_00);
    ::std::operator+(&local_d8,"ERROR: makeLocalPolynomialGrid() is called with rule: ",&local_f8);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                     &local_d8,", which is not a local polynomial rule");
    ::std::__cxx11::string::~string((string *)&local_d8);
    ::std::__cxx11::string::~string((string *)&local_f8);
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    ::std::invalid_argument::invalid_argument(piVar2,(string *)local_b8);
    __cxa_throw(piVar2,&::std::invalid_argument::typeinfo,::std::invalid_argument::~invalid_argument
               );
  }
  bVar1 = ::std::vector<int,_std::allocator<int>_>::empty(level_limits);
  if (!bVar1) {
    sVar3 = ::std::vector<int,_std::allocator<int>_>::size(level_limits);
    if (sVar3 != (long)depth_local) {
      piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
      ::std::invalid_argument::invalid_argument
                (piVar2,
                 "ERROR: makeLocalPolynomialGrid() requires level_limits with either 0 or dimensions entries"
                );
      __cxa_throw(piVar2,&::std::invalid_argument::typeinfo,
                  ::std::invalid_argument::~invalid_argument);
    }
  }
  clear(this);
  ::std::vector<int,_std::allocator<int>_>::operator=(&this->llimits,level_limits);
  local_108 = ::std::
              unique_ptr<TasGrid::AccelerationContext,_std::default_delete<TasGrid::AccelerationContext>_>
              ::get(&this->acceleration);
  Utils::
  make_unique<TasGrid::GridLocalPolynomial,TasGrid::AccelerationContext*,int&,int&,int&,int&,TasGrid::TypeOneDRule&,std::vector<int,std::allocator<int>>&>
            ((Utils *)&local_100,&local_108,&depth_local,&order_local,(int *)&rule_local,&local_20,
             &local_24,&this->llimits);
  ::std::unique_ptr<TasGrid::BaseCanonicalGrid,std::default_delete<TasGrid::BaseCanonicalGrid>>::
  operator=((unique_ptr<TasGrid::BaseCanonicalGrid,std::default_delete<TasGrid::BaseCanonicalGrid>>
             *)&this->base,&local_100);
  ::std::
  unique_ptr<TasGrid::GridLocalPolynomial,_std::default_delete<TasGrid::GridLocalPolynomial>_>::
  ~unique_ptr(&local_100);
  return;
}

Assistant:

void TasmanianSparseGrid::makeLocalPolynomialGrid(int dimensions, int outputs, int depth, int order, TypeOneDRule rule, const std::vector<int> &level_limits){
    if (dimensions < 1) throw std::invalid_argument("ERROR: makeLocalPolynomialGrid() requires positive dimensions");
    if (outputs < 0) throw std::invalid_argument("ERROR: makeLocalPolynomialGrid() requires non-negative outputs");
    if (depth < 0) throw std::invalid_argument("ERROR: makeLocalPolynomialGrid() requires non-negative depth");
    if (order < -1){
        std::string message = "ERROR: makeLocalPolynomialGrid() is called with order: " + std::to_string(order) + ", but the order cannot be less than -1.";
        throw std::invalid_argument(message);
    }
    if (!OneDimensionalMeta::isLocalPolynomial(rule)){
        std::string message = "ERROR: makeLocalPolynomialGrid() is called with rule: " + IO::getRuleString(rule) + ", which is not a local polynomial rule";
        throw std::invalid_argument(message);
    }
    if ((!level_limits.empty()) && (level_limits.size() != (size_t) dimensions)) throw std::invalid_argument("ERROR: makeLocalPolynomialGrid() requires level_limits with either 0 or dimensions entries");
    clear();
    llimits = level_limits;
    base = Utils::make_unique<GridLocalPolynomial>(acceleration.get(), dimensions, outputs, depth, order, rule, llimits);
}